

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

void __thiscall gui::Panel::draw(Panel *this)

{
  RenderTarget *in_stack_00000048;
  Panel *in_stack_00000050;
  undefined1 in_stack_00000060 [104];
  
  draw(in_stack_00000050,in_stack_00000048,(RenderStates)in_stack_00000060);
  return;
}

Assistant:

void Panel::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}